

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O1

void __thiscall
xemmai::ast::t_lambda::f_safe_points
          (t_lambda *this,t_code *a_code,
          map<std::pair<unsigned_long,_void_**>,_unsigned_long,_std::less<std::pair<unsigned_long,_void_**>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>_>
          *a_safe_points,
          vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
          *a_safe_positions)

{
  map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable>_>_>
  *this_00;
  pointer ptVar1;
  _Rb_tree<std::pair<unsigned_long,void**>,std::pair<std::pair<unsigned_long,void**>const,unsigned_long>,std::_Select1st<std::pair<std::pair<unsigned_long,void**>const,unsigned_long>>,std::less<std::pair<unsigned_long,void**>>,std::allocator<std::pair<std::pair<unsigned_long,void**>const,unsigned_long>>>
  *this_01;
  _Rb_tree_node_base *p_Var2;
  t_scope *ptVar3;
  tuple<unsigned_long,_unsigned_long,_unsigned_long> *x;
  pointer __args_1;
  __string_type __str;
  wstring prefix;
  t_variable self;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_98;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_78;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  *local_58;
  _Rb_tree<std::pair<unsigned_long,void**>,std::pair<std::pair<unsigned_long,void**>const,unsigned_long>,std::_Select1st<std::pair<std::pair<unsigned_long,void**>const,unsigned_long>>,std::less<std::pair<unsigned_long,void**>>,std::allocator<std::pair<std::pair<unsigned_long,void**>const,unsigned_long>>>
  *local_50;
  t_code *local_48;
  t_variable local_40;
  
  local_40.v_shared = (this->super_t_scope).v_self_shared;
  local_40.v_varies = false;
  local_40.v_index = -((ulong)local_40.v_shared ^ 1);
  this_00 = &a_code->v_variables;
  local_78._M_dataplus._M_p = (pointer)0x1;
  local_78._M_string_length = 0x17ffa8;
  local_58 = a_safe_positions;
  local_50 = (_Rb_tree<std::pair<unsigned_long,void**>,std::pair<std::pair<unsigned_long,void**>const,unsigned_long>,std::_Select1st<std::pair<std::pair<unsigned_long,void**>const,unsigned_long>>,std::less<std::pair<unsigned_long,void**>>,std::allocator<std::pair<std::pair<unsigned_long,void**>const,unsigned_long>>>
              *)a_safe_points;
  local_48 = a_code;
  std::
  _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
  ::
  _M_emplace_unique<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,xemmai::t_code::t_variable&>
            ((_Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
              *)this_00,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&local_78,
             &local_40);
  for (p_Var2 = (this->super_t_scope).v_variables._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(this->super_t_scope).v_variables._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::
    _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
    ::_M_emplace_unique<std::__cxx11::wstring_const&,xemmai::t_code::t_variable&>
              ((_Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
                *)this_00,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               (*(long *)(*(long *)(p_Var2 + 1) + 0x48) + 0x20),(t_variable *)&p_Var2[1]._M_parent);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = L'\0';
  local_40.v_varies = SUB21((ushort)local_40._0_2_ >> 8,0);
  local_40.v_shared = true;
  local_40.v_index = 0;
  ptVar3 = (this->super_t_scope).v_outer;
  if (ptVar3 != (t_scope *)0x0) {
    do {
      std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
      push_back(&local_78,L':');
      if (ptVar3->v_self_shared == true) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::wstring::_M_construct<wchar_t*>
                  ((wstring *)&local_98,local_78._M_dataplus._M_p,
                   local_78._M_dataplus._M_p + local_78._M_string_length);
        std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
        _M_replace_aux(&local_98,local_98._M_string_length,0,1,L'$');
        std::
        _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
        ::_M_emplace_unique<std::__cxx11::wstring,xemmai::t_code::t_variable&>
                  ((_Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
                    *)this_00,&local_98,&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity * 4 + 4);
        }
      }
      for (p_Var2 = (ptVar3->v_variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != &(ptVar3->v_variables)._M_t._M_impl.super__Rb_tree_header;
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
        if (*(char *)&p_Var2[1]._M_parent == '\x01') {
          std::operator+(&local_98,&local_78,
                         (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                          *)(*(long *)(*(long *)(p_Var2 + 1) + 0x48) + 0x20));
          std::
          _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
          ::_M_emplace_unique<std::__cxx11::wstring,xemmai::t_code::t_variable&>
                    ((_Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
                      *)this_00,&local_98,(t_variable *)&p_Var2[1]._M_parent);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity * 4 + 4
                           );
          }
        }
      }
      ptVar3 = ptVar3->v_outer;
    } while (ptVar3 != (t_scope *)0x0);
  }
  this_01 = local_50;
  ptVar1 = (local_58->
           super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__args_1 = (local_58->
                  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; __args_1 != ptVar1;
      __args_1 = __args_1 + 1) {
    local_98._M_dataplus._M_p =
         (pointer)(__args_1->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
                  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    local_98._M_string_length =
         (size_type)
         ((local_48->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start +
         (__args_1->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
         super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.
         super__Head_base<1UL,_unsigned_long,_false>._M_head_impl);
    std::
    _Rb_tree<std::pair<unsigned_long,void**>,std::pair<std::pair<unsigned_long,void**>const,unsigned_long>,std::_Select1st<std::pair<std::pair<unsigned_long,void**>const,unsigned_long>>,std::less<std::pair<unsigned_long,void**>>,std::allocator<std::pair<std::pair<unsigned_long,void**>const,unsigned_long>>>
    ::_M_emplace_unique<std::pair<unsigned_long,void**>,unsigned_long_const&>
              (this_01,(pair<unsigned_long,_void_**> *)&local_98,(unsigned_long *)__args_1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT44(local_78.field_2._M_local_buf[1],local_78.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  return;
}

Assistant:

void t_lambda::f_safe_points(t_code& a_code, std::map<std::pair<size_t, void**>, size_t>& a_safe_points, const std::vector<std::tuple<size_t, size_t, size_t>>& a_safe_positions)
{
	t_code::t_variable self;
	self.v_shared = v_self_shared;
	self.v_index = v_self_shared ? 0 : -1;
	a_code.v_variables.emplace(L"$"sv, self);
	for (auto& pair : v_variables) a_code.v_variables.emplace(pair.first->f_as<t_symbol>().f_string(), pair.second);
	std::wstring prefix;
	self.v_shared = true;
	self.v_index = 0;
	for (auto scope = v_outer; scope; scope = scope->v_outer) {
		prefix += L':';
		if (scope->v_self_shared) a_code.v_variables.emplace(prefix + L'$', self);
		for (auto& pair : scope->v_variables) if (pair.second.v_shared) a_code.v_variables.emplace(prefix + pair.first->f_as<t_symbol>().f_string(), pair.second);
	}
	for (auto& x : a_safe_positions) a_safe_points.emplace(std::make_pair(std::get<0>(x), &a_code.v_instructions[std::get<1>(x)]), std::get<2>(x));
}